

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void ImportOneRow(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,int pic_width,fixed_y_t *dst
                 )

{
  fixed_y_t fVar1;
  uint uVar2;
  int iVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  long in_R9;
  int off;
  int w;
  int i;
  undefined4 local_2c;
  
  uVar2 = in_R8D + 1 & 0xfffffffe;
  for (local_2c = 0; local_2c < (int)in_R8D; local_2c = local_2c + 1) {
    iVar3 = local_2c * in_ECX;
    fVar1 = UpLift(*(uint8_t *)(in_RDI + iVar3));
    *(fixed_y_t *)(in_R9 + (long)local_2c * 2) = fVar1;
    fVar1 = UpLift(*(uint8_t *)(in_RSI + iVar3));
    *(fixed_y_t *)(in_R9 + (long)(int)(local_2c + uVar2) * 2) = fVar1;
    fVar1 = UpLift(*(uint8_t *)(in_RDX + iVar3));
    *(fixed_y_t *)(in_R9 + (long)(int)(local_2c + uVar2 * 2) * 2) = fVar1;
  }
  if ((in_R8D & 1) != 0) {
    *(undefined2 *)(in_R9 + (long)(int)in_R8D * 2) =
         *(undefined2 *)(in_R9 + (long)(int)(in_R8D - 1) * 2);
    *(undefined2 *)(in_R9 + (long)(int)(in_R8D + uVar2) * 2) =
         *(undefined2 *)(in_R9 + (long)(int)(in_R8D + uVar2 + -1) * 2);
    *(undefined2 *)(in_R9 + (long)(int)(in_R8D + uVar2 * 2) * 2) =
         *(undefined2 *)(in_R9 + (long)(int)(in_R8D + uVar2 * 2 + -1) * 2);
  }
  return;
}

Assistant:

static void ImportOneRow(const uint8_t* const r_ptr,
                         const uint8_t* const g_ptr,
                         const uint8_t* const b_ptr,
                         int step,
                         int pic_width,
                         fixed_y_t* const dst) {
  int i;
  const int w = (pic_width + 1) & ~1;
  for (i = 0; i < pic_width; ++i) {
    const int off = i * step;
    dst[i + 0 * w] = UpLift(r_ptr[off]);
    dst[i + 1 * w] = UpLift(g_ptr[off]);
    dst[i + 2 * w] = UpLift(b_ptr[off]);
  }
  if (pic_width & 1) {  // replicate rightmost pixel
    dst[pic_width + 0 * w] = dst[pic_width + 0 * w - 1];
    dst[pic_width + 1 * w] = dst[pic_width + 1 * w - 1];
    dst[pic_width + 2 * w] = dst[pic_width + 2 * w - 1];
  }
}